

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O0

void read_calendar_date(calendar_date_t *record,int field_count,char **field_names,
                       char **field_values)

{
  int iVar1;
  exception_type_t eVar2;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  calendar_date_t *record_local;
  
  init_calendar_date(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"service_id");
    if (iVar1 == 0) {
      strcpy(record->service_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"date");
      if (iVar1 == 0) {
        strcpy(record->date,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"exception_type");
        if (iVar1 == 0) {
          eVar2 = parse_exception_type(field_values[local_2c]);
          record->exception_type = eVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void read_calendar_date(calendar_date_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_date(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "date") == 0) {
            strcpy(record->date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "exception_type") == 0) {
            record->exception_type = parse_exception_type(field_values[i]);
            continue;
        }
    }
}